

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateWindowing(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiInputSource IVar4;
  int focus_change_dir_00;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  ImGuiNavLayer local_c4;
  ImGuiWindow *local_98;
  bool local_8d;
  ImGuiNavLayer new_nav_layer;
  ImGuiWindow *old_nav_window;
  ImGuiWindow *new_nav_window;
  ImVec2 local_70;
  ImGuiWindow *local_68;
  ImGuiWindow *moving_window;
  undefined4 local_58;
  float move_speed;
  float NAV_MOVE_SPEED;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 move_delta;
  int focus_change_dir;
  ImGuiWindow *window;
  bool start_windowing_with_keyboard;
  bool start_windowing_with_gamepad;
  bool allow_windowing;
  ImGuiWindow *modal_window;
  ImGuiWindow *pIStack_18;
  bool apply_toggle_layer;
  ImGuiWindow *apply_focus_window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  pIStack_18 = (ImGuiWindow *)0x0;
  bVar6 = false;
  pIVar3 = GetTopMostPopupModal();
  bVar5 = pIVar3 == (ImGuiWindow *)0x0;
  if (!bVar5) {
    pIVar1->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar1->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar1->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar7 = ImMax<float>(-(pIVar1->IO).DeltaTime * 10.0 + pIVar1->NavWindowingHighlightAlpha,0.0);
    pIVar1->NavWindowingHighlightAlpha = fVar7;
    if ((pIVar1->DimBgRatio <= 0.0) && (pIVar1->NavWindowingHighlightAlpha <= 0.0)) {
      pIVar1->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  local_8d = false;
  if ((bVar5) && (local_8d = false, pIVar1->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    local_8d = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
  }
  bVar2 = false;
  if (((bVar5) && (bVar2 = false, pIVar1->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     (bVar2 = false, ((pIVar1->IO).KeyCtrl & 1U) != 0)) {
    bVar5 = IsKeyPressedMap(0,true);
    bVar2 = false;
    if (bVar5) {
      bVar2 = ((pIVar1->IO).ConfigFlags & 1U) != 0;
    }
  }
  if ((local_8d != false) || (bVar2)) {
    if (pIVar1->NavWindow == (ImGuiWindow *)0x0) {
      local_98 = FindWindowNavFocusable((pIVar1->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    else {
      local_98 = pIVar1->NavWindow;
    }
    stack0xffffffffffffffc8 = local_98;
    if (local_98 != (ImGuiWindow *)0x0) {
      pIVar3 = local_98->RootWindow;
      pIVar1->NavWindowingTargetAnim = pIVar3;
      pIVar1->NavWindowingTarget = pIVar3;
      pIVar1->NavWindowingHighlightAlpha = 0.0;
      pIVar1->NavWindowingTimer = 0.0;
      pIVar1->NavWindowingToggleLayer = (bool)(bVar2 + '\x01');
      IVar4 = ImGuiInputSource_Gamepad;
      if (bVar2) {
        IVar4 = ImGuiInputSource_Keyboard;
      }
      pIVar1->NavInputSource = IVar4;
    }
  }
  pIVar1->NavWindowingTimer = (pIVar1->IO).DeltaTime + pIVar1->NavWindowingTimer;
  if ((pIVar1->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar1->NavInputSource == ImGuiInputSource_Gamepad)) {
    fVar7 = pIVar1->NavWindowingHighlightAlpha;
    fVar8 = ImSaturate((pIVar1->NavWindowingTimer - 0.2) / 0.05);
    fVar7 = ImMax<float>(fVar7,fVar8);
    pIVar1->NavWindowingHighlightAlpha = fVar7;
    bVar5 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar2 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    move_delta.x = (float)((uint)bVar5 - (uint)bVar2);
    if (move_delta.x != 0.0) {
      NavUpdateWindowingHighlightWindow((int)move_delta.x);
      pIVar1->NavWindowingHighlightAlpha = 1.0;
    }
    bVar5 = IsNavInputDown(3);
    if (!bVar5) {
      pIVar1->NavWindowingToggleLayer =
           (pIVar1->NavWindowingToggleLayer & 1U &
           (pIVar1->NavWindowingHighlightAlpha <= 1.0 && pIVar1->NavWindowingHighlightAlpha != 1.0))
           != 0;
      if (((pIVar1->NavWindowingToggleLayer & 1U) == 0) || (pIVar1->NavWindow == (ImGuiWindow *)0x0)
         ) {
        if ((pIVar1->NavWindowingToggleLayer & 1U) == 0) {
          pIStack_18 = pIVar1->NavWindowingTarget;
        }
      }
      else {
        bVar6 = true;
      }
      pIVar1->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar1->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar1->NavInputSource == ImGuiInputSource_Keyboard)) {
    fVar7 = pIVar1->NavWindowingHighlightAlpha;
    fVar8 = ImSaturate((pIVar1->NavWindowingTimer - 0.2) / 0.05);
    fVar7 = ImMax<float>(fVar7,fVar8);
    pIVar1->NavWindowingHighlightAlpha = fVar7;
    bVar5 = IsKeyPressedMap(0,true);
    if (bVar5) {
      focus_change_dir_00 = -1;
      if (((pIVar1->IO).KeyShift & 1U) != 0) {
        focus_change_dir_00 = 1;
      }
      NavUpdateWindowingHighlightWindow(focus_change_dir_00);
    }
    if (((pIVar1->IO).KeyCtrl & 1U) == 0) {
      pIStack_18 = pIVar1->NavWindowingTarget;
    }
  }
  bVar5 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
  if (bVar5) {
    pIVar1->NavWindowingToggleLayer = true;
  }
  if ((((pIVar1->ActiveId == 0) || ((pIVar1->ActiveIdAllowOverlap & 1U) != 0)) &&
      ((pIVar1->NavWindowingToggleLayer & 1U) != 0)) &&
     (bVar5 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar5)) {
    bVar5 = IsMousePosValid(&(pIVar1->IO).MousePos);
    bVar2 = IsMousePosValid(&(pIVar1->IO).MousePosPrev);
    if (bVar5 == bVar2) {
      bVar6 = true;
    }
  }
  if ((pIVar1->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     ((pIVar1->NavWindowingTarget->Flags & 4U) == 0)) {
    ImVec2::ImVec2(&local_44);
    if ((pIVar1->NavInputSource == ImGuiInputSource_Keyboard) && (((pIVar1->IO).KeyShift & 1U) == 0)
       ) {
      local_4c = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      local_44 = local_4c;
    }
    if (pIVar1->NavInputSource == ImGuiInputSource_Gamepad) {
      _move_speed = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      local_44 = _move_speed;
    }
    if ((local_44.x == 0.0) && (!NAN(local_44.x))) {
      if ((local_44.y == 0.0) && (!NAN(local_44.y))) goto LAB_001773ac;
    }
    local_58 = 0x44480000;
    fVar7 = (pIVar1->IO).DeltaTime;
    fVar8 = ImMin<float>((pIVar1->IO).DisplayFramebufferScale.x,
                         (pIVar1->IO).DisplayFramebufferScale.y);
    moving_window._4_4_ = ImFloor(fVar7 * 800.0 * fVar8);
    pIVar3 = pIVar1->NavWindowingTarget->RootWindow;
    local_68 = pIVar3;
    new_nav_window = (ImGuiWindow *)::operator*(&local_44,moving_window._4_4_);
    local_70 = ::operator+(&pIVar3->Pos,(ImVec2 *)&new_nav_window);
    SetWindowPos(pIVar3,&local_70,1);
    MarkIniSettingsDirty(local_68);
    pIVar1->NavDisableMouseHover = true;
  }
LAB_001773ac:
  if ((pIStack_18 != (ImGuiWindow *)0x0) &&
     ((pIVar1->NavWindow == (ImGuiWindow *)0x0 || (pIStack_18 != pIVar1->NavWindow->RootWindow)))) {
    ClearActiveID();
    pIVar1->NavDisableHighlight = false;
    pIVar1->NavDisableMouseHover = true;
    pIStack_18 = NavRestoreLastChildNavWindow(pIStack_18);
    ClosePopupsOverWindow(pIStack_18,false);
    FocusWindow(pIStack_18);
    if (pIStack_18->NavLastIds[0] == 0) {
      NavInitWindow(pIStack_18,false);
    }
    if ((pIStack_18->DC).NavLayersActiveMaskNext == 2) {
      pIVar1->NavLayer = ImGuiNavLayer_Menu;
    }
  }
  if (pIStack_18 != (ImGuiWindow *)0x0) {
    pIVar1->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar6) && (pIVar1->NavWindow != (ImGuiWindow *)0x0)) {
    ClearActiveID();
    old_nav_window = pIVar1->NavWindow;
    while( true ) {
      bVar6 = false;
      if (((old_nav_window->ParentWindow != (ImGuiWindow *)0x0) &&
          (bVar6 = false, ((old_nav_window->DC).NavLayersActiveMask & 2U) == 0)) &&
         (bVar6 = false, (old_nav_window->Flags & 0x1000000U) != 0)) {
        bVar6 = (old_nav_window->Flags & 0x14000000U) == 0;
      }
      if (!bVar6) break;
      old_nav_window = old_nav_window->ParentWindow;
    }
    if (old_nav_window != pIVar1->NavWindow) {
      pIVar3 = pIVar1->NavWindow;
      FocusWindow(old_nav_window);
      old_nav_window->NavLastChildNavWindow = pIVar3;
    }
    pIVar1->NavDisableHighlight = false;
    pIVar1->NavDisableMouseHover = true;
    if (((pIVar1->NavWindow->DC).NavLayersActiveMask & 2U) == 0) {
      local_c4 = ImGuiNavLayer_Main;
    }
    else {
      local_c4 = pIVar1->NavLayer ^ ImGuiNavLayer_Menu;
    }
    if (local_c4 == ImGuiNavLayer_Menu) {
      pIVar1->NavWindow->NavLastIds[1] = 0;
    }
    NavRestoreLayer(local_c4);
  }
  return;
}

Assistant:

static void ImGui::NavUpdateWindowing()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* apply_focus_window = NULL;
    bool apply_toggle_layer = false;

    ImGuiWindow* modal_window = GetTopMostPopupModal();
    bool allow_windowing = (modal_window == NULL);
    if (!allow_windowing)
        g.NavWindowingTarget = NULL;

    // Fade out
    if (g.NavWindowingTargetAnim && g.NavWindowingTarget == NULL)
    {
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha - g.IO.DeltaTime * 10.0f, 0.0f);
        if (g.DimBgRatio <= 0.0f && g.NavWindowingHighlightAlpha <= 0.0f)
            g.NavWindowingTargetAnim = NULL;
    }

    // Start CTRL-TAB or Square+L/R window selection
    bool start_windowing_with_gamepad = allow_windowing && !g.NavWindowingTarget && IsNavInputTest(ImGuiNavInput_Menu, ImGuiInputReadMode_Pressed);
    bool start_windowing_with_keyboard = allow_windowing && !g.NavWindowingTarget && g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab) && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard);
    if (start_windowing_with_gamepad || start_windowing_with_keyboard)
        if (ImGuiWindow* window = g.NavWindow ? g.NavWindow : FindWindowNavFocusable(g.WindowsFocusOrder.Size - 1, -INT_MAX, -1))
        {
            g.NavWindowingTarget = g.NavWindowingTargetAnim = window->RootWindow; // FIXME-DOCK: Will need to use RootWindowDockStop
            g.NavWindowingTimer = g.NavWindowingHighlightAlpha = 0.0f;
            g.NavWindowingToggleLayer = start_windowing_with_keyboard ? false : true;
            g.NavInputSource = start_windowing_with_keyboard ? ImGuiInputSource_Keyboard : ImGuiInputSource_Gamepad;
        }

    // Gamepad update
    g.NavWindowingTimer += g.IO.DeltaTime;
    if (g.NavWindowingTarget && g.NavInputSource == ImGuiInputSource_Gamepad)
    {
        // Highlight only appears after a brief time holding the button, so that a fast tap on PadMenu (to toggle NavLayer) doesn't add visual noise
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha, ImSaturate((g.NavWindowingTimer - NAV_WINDOWING_HIGHLIGHT_DELAY) / 0.05f));

        // Select window to focus
        const int focus_change_dir = (int)IsNavInputTest(ImGuiNavInput_FocusPrev, ImGuiInputReadMode_RepeatSlow) - (int)IsNavInputTest(ImGuiNavInput_FocusNext, ImGuiInputReadMode_RepeatSlow);
        if (focus_change_dir != 0)
        {
            NavUpdateWindowingHighlightWindow(focus_change_dir);
            g.NavWindowingHighlightAlpha = 1.0f;
        }

        // Single press toggles NavLayer, long press with L/R apply actual focus on release (until then the window was merely rendered top-most)
        if (!IsNavInputDown(ImGuiNavInput_Menu))
        {
            g.NavWindowingToggleLayer &= (g.NavWindowingHighlightAlpha < 1.0f); // Once button was held long enough we don't consider it a tap-to-toggle-layer press anymore.
            if (g.NavWindowingToggleLayer && g.NavWindow)
                apply_toggle_layer = true;
            else if (!g.NavWindowingToggleLayer)
                apply_focus_window = g.NavWindowingTarget;
            g.NavWindowingTarget = NULL;
        }
    }

    // Keyboard: Focus
    if (g.NavWindowingTarget && g.NavInputSource == ImGuiInputSource_Keyboard)
    {
        // Visuals only appears after a brief time after pressing TAB the first time, so that a fast CTRL+TAB doesn't add visual noise
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha, ImSaturate((g.NavWindowingTimer - NAV_WINDOWING_HIGHLIGHT_DELAY) / 0.05f)); // 1.0f
        if (IsKeyPressedMap(ImGuiKey_Tab, true))
            NavUpdateWindowingHighlightWindow(g.IO.KeyShift ? +1 : -1);
        if (!g.IO.KeyCtrl)
            apply_focus_window = g.NavWindowingTarget;
    }

    // Keyboard: Press and Release ALT to toggle menu layer
    // FIXME: We lack an explicit IO variable for "is the imgui window focused", so compare mouse validity to detect the common case of backend clearing releases all keys on ALT-TAB
    if (IsNavInputTest(ImGuiNavInput_KeyMenu_, ImGuiInputReadMode_Pressed))
        g.NavWindowingToggleLayer = true;
    if ((g.ActiveId == 0 || g.ActiveIdAllowOverlap) && g.NavWindowingToggleLayer && IsNavInputTest(ImGuiNavInput_KeyMenu_, ImGuiInputReadMode_Released))
        if (IsMousePosValid(&g.IO.MousePos) == IsMousePosValid(&g.IO.MousePosPrev))
            apply_toggle_layer = true;

    // Move window
    if (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoMove))
    {
        ImVec2 move_delta;
        if (g.NavInputSource == ImGuiInputSource_Keyboard && !g.IO.KeyShift)
            move_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_Gamepad)
            move_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadLStick, ImGuiInputReadMode_Down);
        if (move_delta.x != 0.0f || move_delta.y != 0.0f)
        {
            const float NAV_MOVE_SPEED = 800.0f;
            const float move_speed = ImFloor(NAV_MOVE_SPEED * g.IO.DeltaTime * ImMin(g.IO.DisplayFramebufferScale.x, g.IO.DisplayFramebufferScale.y)); // FIXME: Doesn't handle variable framerate very well
            ImGuiWindow* moving_window = g.NavWindowingTarget->RootWindow;
            SetWindowPos(moving_window, moving_window->Pos + move_delta * move_speed, ImGuiCond_Always);
            MarkIniSettingsDirty(moving_window);
            g.NavDisableMouseHover = true;
        }
    }

    // Apply final focus
    if (apply_focus_window && (g.NavWindow == NULL || apply_focus_window != g.NavWindow->RootWindow))
    {
        ClearActiveID();
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = true;
        apply_focus_window = NavRestoreLastChildNavWindow(apply_focus_window);
        ClosePopupsOverWindow(apply_focus_window, false);
        FocusWindow(apply_focus_window);
        if (apply_focus_window->NavLastIds[0] == 0)
            NavInitWindow(apply_focus_window, false);

        // If the window has ONLY a menu layer (no main layer), select it directly
        // Use NavLayersActiveMaskNext since windows didn't have a chance to be Begin()-ed on this frame,
        // so CTRL+Tab where the keys are only held for 1 frame will be able to use correct layers mask since
        // the target window as already been previewed once.
        // FIXME-NAV: This should be done in NavInit.. or in FocusWindow... However in both of those cases,
        // we won't have a guarantee that windows has been visible before and therefore NavLayersActiveMask*
        // won't be valid.
        if (apply_focus_window->DC.NavLayersActiveMaskNext == (1 << ImGuiNavLayer_Menu))
            g.NavLayer = ImGuiNavLayer_Menu;
    }
    if (apply_focus_window)
        g.NavWindowingTarget = NULL;

    // Apply menu/layer toggle
    if (apply_toggle_layer && g.NavWindow)
    {
        ClearActiveID();

        // Move to parent menu if necessary
        ImGuiWindow* new_nav_window = g.NavWindow;
        while (new_nav_window->ParentWindow
            && (new_nav_window->DC.NavLayersActiveMask & (1 << ImGuiNavLayer_Menu)) == 0
            && (new_nav_window->Flags & ImGuiWindowFlags_ChildWindow) != 0
            && (new_nav_window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu)) == 0)
            new_nav_window = new_nav_window->ParentWindow;
        if (new_nav_window != g.NavWindow)
        {
            ImGuiWindow* old_nav_window = g.NavWindow;
            FocusWindow(new_nav_window);
            new_nav_window->NavLastChildNavWindow = old_nav_window;
        }
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = true;

        // Reinitialize navigation when entering menu bar with the Alt key.
        const ImGuiNavLayer new_nav_layer = (g.NavWindow->DC.NavLayersActiveMask & (1 << ImGuiNavLayer_Menu)) ? (ImGuiNavLayer)((int)g.NavLayer ^ 1) : ImGuiNavLayer_Main;
        if (new_nav_layer == ImGuiNavLayer_Menu)
            g.NavWindow->NavLastIds[new_nav_layer] = 0;
        NavRestoreLayer(new_nav_layer);
    }
}